

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall HttpResponse::parseHttpEnvelope(HttpResponse *this)

{
  StringBufferHelper *pSVar1;
  allocator local_f1;
  string local_f0 [32];
  undefined1 local_d0 [40];
  string local_a8 [32];
  StringBufferHelper local_88;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [40];
  HttpResponse *this_local;
  
  pSVar1 = this->_pRawBuffer;
  local_30._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50," ",&local_51);
  StringBufferHelper::GetNextSegmentBySeparator((StringBufferHelper *)local_30,&pSVar1->_buffer);
  std::__cxx11::string::operator=((string *)&this->_httpVersion,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pSVar1 = this->_pRawBuffer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8," ",(allocator *)(local_d0 + 0x27));
  StringBufferHelper::GetNextSegmentBySeparator(&local_88,&pSVar1->_buffer);
  std::__cxx11::string::operator=((string *)&this->_httpStatusCode,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x27));
  pSVar1 = this->_pRawBuffer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"\n",&local_f1);
  StringBufferHelper::GetNextSegmentBySeparator((StringBufferHelper *)local_d0,&pSVar1->_buffer);
  std::__cxx11::string::operator=((string *)&this->_httpStatusText,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

void HttpResponse::parseHttpEnvelope() {
  _httpVersion = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusCode = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusText = _pRawBuffer->GetNextSegmentBySeparator("\n");
}